

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

uint32_t google::protobuf::ghtonl(uint32_t x)

{
  undefined4 local_10;
  uint32_t result;
  uint32_t x_local;
  
  local_10 = CONCAT13((char)x,CONCAT12((char)(x >> 8),CONCAT11((char)(x >> 0x10),(char)(x >> 0x18)))
                     );
  return local_10;
}

Assistant:

uint32_t ghtonl(uint32_t x) {
  union {
    uint32_t result;
    uint8_t result_array[4];
  };
  result_array[0] = static_cast<uint8_t>(x >> 24);
  result_array[1] = static_cast<uint8_t>((x >> 16) & 0xFF);
  result_array[2] = static_cast<uint8_t>((x >> 8) & 0xFF);
  result_array[3] = static_cast<uint8_t>(x & 0xFF);
  return result;
}